

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::genBlockSource_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          deInt64 numSSBlocks,GLenum shaderType)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  string *psVar5;
  long lVar6;
  int iVar7;
  ostringstream source;
  undefined1 auStack_1a8 [8];
  undefined1 local_1a0 [376];
  
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(*(long *)this + 0x10))(this);
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)(auStack_1a8 + (long)*(_func_int **)(local_1a0._0_8_ + -0x18)) + 8);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  pcVar2 = ::glcts::fixed_sample_locations_values + 1;
  iVar7 = (int)numSSBlocks;
  if (!bVar1) {
    if (iVar7 - 0x8e87U < 2) {
      pcVar2 = "#extension GL_EXT_tessellation_shader : require\n";
    }
    else if (iVar7 == 0x8dd9) {
      pcVar2 = "#extension GL_EXT_geometry_shader : require\n";
    }
  }
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar2,sVar3);
  if (iVar7 < 0x8e88) {
    if (iVar7 == 0x8dd9) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"layout(points) in;\n",0x13);
      lVar6 = 0x2a;
      pcVar2 = "layout(line_strip, max_vertices = 3) out;\n";
    }
    else {
      if (iVar7 != 0x8e87) goto LAB_016741f0;
      lVar6 = 0x16;
      pcVar2 = "layout(triangles) in;\n";
    }
  }
  else if (iVar7 == 0x8e88) {
    lVar6 = 0x1b;
    pcVar2 = "layout(vertices = 10) out;\n";
  }
  else {
    if (iVar7 != 0x91b9) goto LAB_016741f0;
    lVar6 = 0x1e;
    pcVar2 = "layout (local_size_x = 1) in;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar2,lVar6);
LAB_016741f0:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"layout(std430, binding = 0) buffer Block {\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"    int value;\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"} sb_in[",8);
  poVar4 = std::ostream::_M_insert<long>((long)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"void main(void) { sb_in[0].value = 1; }\n",0x28);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  psVar5 = (string *)std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return psVar5;
}

Assistant:

std::string genBlockSource (NegativeTestContext& ctx, deInt64 numSSBlocks, glw::GLenum shaderType)
{
	const bool				isES32		= contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version		= isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	std::ostringstream		source;

	source	<< glu::getGLSLVersionDeclaration(version) << "\n"
			<< ((isES32) ? "" : getShaderExtensionDeclaration(shaderType));

	switch (shaderType)
	{
		case GL_VERTEX_SHADER:
		case GL_FRAGMENT_SHADER:
			break;

		case GL_COMPUTE_SHADER:
			source << "layout (local_size_x = 1) in;\n";
			break;

		case GL_GEOMETRY_SHADER:
			source << "layout(points) in;\n"
				   << "layout(line_strip, max_vertices = 3) out;\n";
			break;

		case GL_TESS_CONTROL_SHADER:
			source << "layout(vertices = 10) out;\n";
			break;

		case GL_TESS_EVALUATION_SHADER:
			source << "layout(triangles) in;\n";
			break;

		default:
			DE_FATAL("Unknown shader type");
			break;
	}

	source  << "\n"
			<< "layout(std430, binding = 0) buffer Block {\n"
			<< "    int value;\n"
			<< "} sb_in[" << numSSBlocks << "];\n"
			<< "void main(void) { sb_in[0].value = 1; }\n";

	return source.str();
}